

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<float>::DecomposeColumn
          (TPZSkylMatrix<float> *this,int64_t col,int64_t prevcol,
          list<long,_std::allocator<long>_> *singular)

{
  float fVar1;
  float **ppfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  int64_t local_10;
  
  ppfVar2 = (this->fElem).fStore;
  pfVar3 = ppfVar2[prevcol];
  lVar6 = (prevcol - ((long)ppfVar2[prevcol + 1] - (long)pfVar3 >> 2)) + 1;
  lVar5 = (col - ((long)ppfVar2[col + 1] - (long)ppfVar2[col] >> 2)) + 1;
  if (lVar5 < lVar6) {
    lVar5 = lVar6;
  }
  local_10 = col;
  if (prevcol < lVar5) {
    std::operator<<((ostream *)&std::cout,"error condition\n");
    std::ostream::flush();
    return;
  }
  pfVar4 = ppfVar2[col] + (col - lVar5);
  fVar7 = 0.0;
  for (lVar5 = prevcol * 4 + lVar5 * -4; lVar5 != 0; lVar5 = lVar5 + -4) {
    fVar1 = *pfVar4;
    pfVar4 = pfVar4 + -1;
    fVar7 = fVar7 + *(float *)((long)pfVar3 + lVar5) * fVar1;
  }
  fVar7 = *pfVar4 - fVar7;
  *pfVar4 = fVar7;
  if (pfVar4 == pfVar3) {
    if (ABS(fVar7) < 1e-10) {
      std::__cxx11::list<long,_std::allocator<long>_>::push_back(singular,&local_10);
      fVar7 = 1.0;
    }
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
  }
  else {
    fVar7 = fVar7 / *pfVar3;
  }
  *pfVar4 = fVar7;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn(int64_t col, int64_t prevcol,std::list<int64_t> &singular){
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + (prevcol-minline);
    TVar *run2 = ptrcol + (col-minline);
    TVar sum = 0;
    
    while(run1 != ptrprev) sum += (*run1--)*(*run2--);
    *run2-=sum;
    if(run1 != run2){
        *run2 /= *run1;
    }else{
        TVar pivot = *run2;
        if ( fabs(pivot) < fabs((TVar)1.e-10) ) {
#ifdef PZ_LOG
            std::stringstream sout;
            sout << "equation " << col << " is singular pivot " << pivot;
            LOGPZ_WARN(logger,sout.str())
#endif
            singular.push_back(col);
            pivot = 1.;
        }
        
        *run2=sqrt(pivot);
    }
    
}